

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  pointer pIVar2;
  Instruction *pIVar3;
  pointer puVar4;
  byte bVar5;
  InstructionList *pIVar6;
  bool bVar7;
  bool bVar8;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  Instruction *dbg_line;
  pointer pIVar9;
  pointer puVar10;
  Instruction *di;
  pointer pIVar11;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  Function *pFVar12;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  pointer puVar13;
  Instruction *dbg_line_1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_58;
  undefined4 local_4c;
  Function *local_48;
  undefined4 local_3c;
  pointer local_38;
  
  local_3c = CONCAT31(in_register_00000009,run_on_non_semantic_insts);
  local_4c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  _Var1._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_48 = this;
  if (_Var1._M_head_impl != (pointer)0x0) {
    if (run_on_debug_line_insts) {
      pIVar11 = *(pointer *)((long)&(_Var1._M_head_impl)->dbg_line_insts_ + 8);
      for (pIVar9 = *(pointer *)
                     &((_Var1._M_head_impl)->dbg_line_insts_).
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ._M_impl; pIVar9 != pIVar11; pIVar9 = pIVar9 + 1) {
        local_58._M_head_impl = pIVar9;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
        bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar7) {
          return false;
        }
      }
    }
    local_58._M_head_impl = _Var1._M_head_impl;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
    bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    if (!bVar7) {
      return false;
    }
  }
  puVar13 = (local_48->params_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (local_48->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != local_38) {
    do {
      pIVar9 = (puVar13->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((char)local_4c != '\0') {
        pIVar2 = *(pointer *)
                  ((long)&(pIVar9->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        for (pIVar11 = (pIVar9->dbg_line_insts_).
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl.super__Vector_impl_data._M_start; pIVar11 != pIVar2;
            pIVar11 = pIVar11 + 1) {
          local_58._M_head_impl = pIVar11;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
          bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar7) {
            return false;
          }
        }
      }
      local_58._M_head_impl = pIVar9;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
      bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar7) {
        return false;
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != local_38);
  }
  pIVar6 = &local_48->debug_insts_in_header_;
  for (pIVar3 = (local_48->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      bVar7 = (bool)(char)local_4c,
      pIVar3 != &(pIVar6->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_;
      pIVar3 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if ((bool)(char)local_4c != false) {
      pIVar11 = (pIVar3->dbg_line_insts_).
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar9 = (pIVar3->dbg_line_insts_).
                    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar11;
          pIVar9 = pIVar9 + 1) {
        local_58._M_head_impl = pIVar9;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
        bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar7) {
          return false;
        }
      }
    }
    local_58._M_head_impl = pIVar3;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
    bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    if (!bVar7) {
      return false;
    }
  }
  puVar4 = (local_48->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar10 = (local_48->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar4;
      puVar10 = (pointer)((long)puVar10 + 8)) {
    bVar8 = BasicBlock::WhileEachInst(*(BasicBlock **)puVar10,f,bVar7);
    if (!bVar8) {
      return false;
    }
  }
  pIVar9 = *(pointer *)
            &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)((long)local_48 + 0xb0))->_M_t;
  if (pIVar9 == (pointer)0x0) {
    bVar7 = true;
    bVar5 = (byte)local_3c;
  }
  else {
    if ((char)local_4c != '\0') {
      pIVar2 = *(pointer *)
                ((long)&(pIVar9->dbg_line_insts_).
                        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                + 8);
      for (pIVar11 = (pIVar9->dbg_line_insts_).
                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar11 != pIVar2;
          pIVar11 = pIVar11 + 1) {
        local_58._M_head_impl = pIVar11;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
        bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar7) {
          return false;
        }
      }
    }
    local_58._M_head_impl = pIVar9;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00216437:
      std::__throw_bad_function_call();
    }
    bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    bVar5 = (byte)local_3c & bVar7;
  }
  if (bVar5 != 0) {
    pFVar12 = (Function *)
              (local_48->non_semantic_).
              super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (Function *)
               (local_48->non_semantic_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar12 == local_48) {
      bVar7 = true;
    }
    else {
      do {
        pIVar9 = (pFVar12->def_inst_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if ((char)local_4c != '\0') {
          pIVar2 = *(pointer *)
                    ((long)&(pIVar9->dbg_line_insts_).
                            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    + 8);
          for (pIVar11 = (pIVar9->dbg_line_insts_).
                         super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar11 != pIVar2;
              pIVar11 = pIVar11 + 1) {
            local_58._M_head_impl = pIVar11;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
            bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
            if (!bVar7) {
              return false;
            }
          }
        }
        local_58._M_head_impl = pIVar9;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00216437;
        bVar7 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      } while ((bVar7) && (pFVar12 = (Function *)&pFVar12->params_, pFVar12 != local_48));
    }
  }
  return bVar7;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(const Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) const {
  if (def_inst_) {
    if (!static_cast<const Instruction*>(def_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& param : params_) {
    if (!static_cast<const Instruction*>(param.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& di : debug_insts_in_header_) {
    if (!static_cast<const Instruction*>(&di)->WhileEachInst(
            f, run_on_debug_line_insts))
      return false;
  }

  for (const auto& bb : blocks_) {
    if (!static_cast<const BasicBlock*>(bb.get())->WhileEachInst(
            f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!static_cast<const Instruction*>(end_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!static_cast<const Instruction*>(non_semantic.get())
               ->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}